

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uint ZSTD_getLongOffsetsShare(ZSTD_seqSymbol *offTable)

{
  uint uVar1;
  byte bVar2;
  int local_34;
  uint local_30;
  U32 total;
  U32 u;
  U32 max;
  ZSTD_seqSymbol *table;
  U32 tableLog;
  void *ptr;
  ZSTD_seqSymbol *offTable_local;
  
  bVar2 = (byte)offTable->baseValue;
  uVar1 = 1 << (bVar2 & 0x1f);
  local_34 = 0;
  if (0x100 < uVar1) {
    __assert_fail("max <= (1 << OffFSELog)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6597,"unsigned int ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol *)");
  }
  for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
    if (0x16 < offTable[(ulong)local_30 + 1].nbAdditionalBits) {
      local_34 = local_34 + 1;
    }
  }
  if (offTable->baseValue < 9) {
    return local_34 << (8 - bVar2 & 0x1f);
  }
  __assert_fail("tableLog <= OffFSELog",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x659c,"unsigned int ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol *)");
}

Assistant:

static unsigned
ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol* offTable)
{
    const void* ptr = offTable;
    U32 const tableLog = ((const ZSTD_seqSymbol_header*)ptr)[0].tableLog;
    const ZSTD_seqSymbol* table = offTable + 1;
    U32 const max = 1 << tableLog;
    U32 u, total = 0;
    DEBUGLOG(5, "ZSTD_getLongOffsetsShare: (tableLog=%u)", tableLog);

    assert(max <= (1 << OffFSELog));  /* max not too large */
    for (u=0; u<max; u++) {
        if (table[u].nbAdditionalBits > 22) total += 1;
    }

    assert(tableLog <= OffFSELog);
    total <<= (OffFSELog - tableLog);  /* scale to OffFSELog */

    return total;
}